

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SubDMeshFragment * __thiscall ON_SubDMesh::FaceFragment(ON_SubDMesh *this,ON_SubDFace *face)

{
  ON_SubDMeshFragment *pOVar1;
  
  if ((face != (ON_SubDFace *)0x0) &&
     (pOVar1 = (ON_SubDMeshFragment *)
               (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, pOVar1 != (ON_SubDMeshFragment *)0x0)) {
    while( true ) {
      pOVar1 = pOVar1->m_next_fragment;
      if (pOVar1 == (ON_SubDMeshFragment *)0x0) break;
      if (pOVar1->m_face == face) {
        return pOVar1;
      }
    }
  }
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMesh::FaceFragment(
  const class ON_SubDFace* face
) const
{
  if (nullptr == face)
    return nullptr;
  for (const ON_SubDMeshFragment* fragment = FirstFragment(); nullptr != fragment; fragment = fragment->m_next_fragment)
  {
    if (face == fragment->m_face)
      return fragment;
  }
  return nullptr;
}